

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void FM::OPNB::InitADPCMATable(void)

{
  int i;
  ulong uVar1;
  int j;
  long lVar2;
  undefined4 *puVar3;
  double dVar4;
  
  puVar3 = &jedi_table;
  for (uVar1 = 0; uVar1 != 0x31; uVar1 = uVar1 + 1) {
    dVar4 = (double)__powidf2(0x3ff199999999999a,uVar1 & 0xffffffff);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      puVar3[lVar2] = ((int)InitADPCMATable::table2[lVar2] * (int)(dVar4 * 16.0 * 3.0)) / 8;
    }
    puVar3 = puVar3 + 0x10;
  }
  return;
}

Assistant:

void OPNB::InitADPCMATable()
{
	const static int8 table2[] =
	{
		 1,  3,  5,  7,  9, 11, 13, 15,
		-1, -3, -5, -7, -9,-11,-13,-15,
	};

	for (int i=0; i<=48; i++)
	{
		int s = int(16.0 * pow (1.1, i) * 3);
		for (int j=0; j<16; j++)
		{
			jedi_table[i*16+j] = s * table2[j] / 8;
		}
	}
}